

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

LOs __thiscall Omega_h::invert_fan(Omega_h *this,LOs *a2b)

{
  Alloc *pAVar1;
  int iVar2;
  void *extraout_RDX;
  ulong uVar3;
  size_t sVar4;
  LOs LVar5;
  Write<int> b2a;
  string local_a8;
  Write<int> local_88;
  Write<int> local_78;
  Write<int> local_68;
  Write<int> local_58;
  type f;
  
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  iVar2 = Read<int>::last((Read<signed_char> *)a2b);
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_68);
  Write<int>::Write(&b2a,iVar2,-1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  Write<int>::Write((Write<int> *)&f,&a2b->write_);
  Write<int>::Write(&f.b2a,&b2a);
  Write<int>::Write(&local_68,(Write<int> *)&f);
  Write<int>::Write(&local_58,&f.b2a);
  if (1 < (int)(sVar4 >> 2)) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_a8,&local_68);
    Write<int>::Write((Write<int> *)&local_a8.field_2,&local_58);
    entering_parallel = 0;
    for (uVar3 = 0; ((sVar4 >> 2) + 0xffffffff & 0xffffffff) != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = *(int *)(local_a8._M_string_length + uVar3 * 4);
      if (iVar2 != *(int *)(local_a8._M_string_length + uVar3 * 4 + 4)) {
        *(int *)(local_a8.field_2._8_8_ + (long)iVar2 * 4) = (int)uVar3;
      }
    }
    invert_fan(Omega_h::Read<int>)::$_0::~__0((__0 *)&local_a8);
  }
  invert_fan(Omega_h::Read<int>)::$_0::~__0((__0 *)&local_68);
  Write<int>::Write(&local_78,&b2a);
  fill_right(&local_78);
  Write<int>::~Write(&local_78);
  Write<int>::Write(&local_88,&b2a);
  Read<int>::Read((Read<signed_char> *)this,&local_88);
  Write<int>::~Write(&local_88);
  invert_fan(Omega_h::Read<int>)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&b2a);
  LVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar5.write_.shared_alloc_;
}

Assistant:

LOs invert_fan(LOs a2b) {
  auto na = a2b.size() - 1;
  auto nb = a2b.last();
  Write<LO> b2a(nb, -1);
  auto f = OMEGA_H_LAMBDA(LO a) {
    if (a2b[a] != a2b[a + 1]) b2a[a2b[a]] = a;
  };
  parallel_for(na, f, "invert_fan");
  fill_right(b2a);
  return b2a;
}